

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

ChVector<double> * __thiscall
chrono::curiosity::Curiosity::GetWheelContactTorque
          (ChVector<double> *__return_storage_ptr__,Curiosity *this,CuriosityWheelID id)

{
  __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  undefined1 local_30 [28];
  CuriosityWheelID id_local;
  Curiosity *this_local;
  
  local_30._20_4_ = id;
  unique0x10000092 = this;
  this_local = (Curiosity *)__return_storage_ptr__;
  this_00 = (__shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                         (&this->m_wheels,(ulong)id);
  std::
  __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->(this_00);
  CuriosityPart::GetBody((CuriosityPart *)local_30);
  std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  chrono::ChBody::GetContactTorque();
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> Curiosity::GetWheelContactTorque(CuriosityWheelID id) const {
    return m_wheels[id]->GetBody()->GetContactTorque();
}